

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh.h
# Opt level: O2

void __thiscall
bvh_node::bvh_node(bvh_node *this,
                  vector<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>
                  *objects,size_t start,size_t end,double time0,double time1)

{
  shared_ptr<hittable> *this_00;
  __normal_iterator<std::shared_ptr<hittable>_*,_std::vector<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>_>
  __first;
  pointer psVar1;
  element_type *peVar2;
  vector<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_> *pvVar3;
  bool bVar4;
  int iVar5;
  code *pcVar6;
  code *pcVar7;
  element_type *extraout_RDX;
  __shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2> *p_Var8;
  __shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2> *p_Var9;
  ulong uVar10;
  _Iter_comp_iter<bool_(*)(std::shared_ptr<hittable>,_std::shared_ptr<hittable>)> __comp;
  __shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2> *p_Var11;
  double dVar12;
  double dVar13;
  shared_ptr<hittable> sVar14;
  shared_ptr<hittable> sVar15;
  aabb box_left;
  aabb box_right;
  double local_f0;
  double local_e8;
  double local_e0;
  __shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2> *local_d8;
  vector<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_> *local_d0;
  double local_c8;
  size_t local_c0;
  vector<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_> local_b8;
  double dStack_a0;
  double local_98;
  double dStack_90;
  double local_88;
  double dStack_80;
  double local_78;
  double dStack_70;
  double local_68;
  double dStack_60;
  undefined1 local_50 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  __shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  (this->super_hittable)._vptr_hittable = (_func_int **)&PTR_hit_0012c038;
  local_d8 = &(this->left).super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>;
  this_00 = &this->right;
  (this->left).super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  (this->left).super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->right).super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->right).super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->box)._min.e[0] = 0.0;
  (this->box)._min.e[1] = 0.0;
  (this->box)._min.e[2] = 0.0;
  (this->box)._max.e[0] = 0.0;
  (this->box)._max.e[1] = 0.0;
  (this->box)._max.e[2] = 0.0;
  local_f0 = time0;
  local_e8 = time0;
  local_e0 = time1;
  local_c8 = (double)end;
  local_c0 = start;
  dVar12 = random_double();
  iVar5 = (int)(dVar12 * 3.0 + 0.0);
  pcVar6 = box_y_compare;
  pcVar7 = box_z_compare;
  if (iVar5 == 1) {
    pcVar7 = box_y_compare;
  }
  __comp._M_comp = box_x_compare;
  if (iVar5 != 0) {
    __comp._M_comp = pcVar7;
  }
  uVar10 = end - start;
  psVar1 = (objects->
           super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  __first._M_current = psVar1 + start;
  local_d0 = objects;
  if (uVar10 == 2) {
    std::__shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_40,
               &(__first._M_current)->super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>);
    pvVar3 = local_d0;
    std::__shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2> *)local_50,
               &(local_d0->
                super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>
                )._M_impl.super__Vector_impl_data._M_start[start + 1].
                super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>);
    sVar14.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50;
    sVar14.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)&local_40;
    sVar15.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pcVar6;
    sVar15.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr = extraout_RDX;
    bVar4 = (*__comp._M_comp)(sVar14,sVar15);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
    p_Var11 = local_d8;
    p_Var8 = &(pvVar3->
              super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>
              )._M_impl.super__Vector_impl_data._M_start[start].
              super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>;
    p_Var9 = &this_00->super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>;
    if (bVar4) {
      std::__shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>::operator=(local_d8,p_Var8);
      p_Var8 = &(pvVar3->
                super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>
                )._M_impl.super__Vector_impl_data._M_start[start + 1].
                super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>;
    }
    else {
      std::__shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>::operator=(local_d8,p_Var8 + 1);
      p_Var8 = &(pvVar3->
                super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>
                )._M_impl.super__Vector_impl_data._M_start[start].
                super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>;
    }
LAB_001058cd:
    std::__shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>::operator=(p_Var9,p_Var8);
    dVar12 = local_e8;
    dVar13 = local_e0;
  }
  else {
    if (uVar10 == 1) {
      std::__shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&this_00->super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>,
                 &(__first._M_current)->super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>);
      p_Var8 = &this_00->super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>;
      p_Var9 = local_d8;
      p_Var11 = local_d8;
      goto LAB_001058cd;
    }
    std::
    __sort<__gnu_cxx::__normal_iterator<std::shared_ptr<hittable>*,std::vector<std::shared_ptr<hittable>,std::allocator<std::shared_ptr<hittable>>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(std::shared_ptr<hittable>,std::shared_ptr<hittable>)>>
              (__first,psVar1 + end,__comp);
    pvVar3 = local_d0;
    local_88 = (double)((uVar10 >> 1) + start);
    std::
    make_shared<bvh_node,std::vector<std::shared_ptr<hittable>,std::allocator<std::shared_ptr<hittable>>>&,unsigned_long&,unsigned_long&,double&,double&>
              (&local_b8,(unsigned_long *)local_d0,&local_c0,&local_88,&local_f0);
    p_Var11 = local_d8;
    std::__shared_ptr<hittable,(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<hittable,(__gnu_cxx::_Lock_policy)2> *)local_d8,
               (__shared_ptr<bvh_node,_(__gnu_cxx::_Lock_policy)2> *)&local_b8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &local_b8.
                super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>
                ._M_impl.super__Vector_impl_data._M_finish);
    std::
    make_shared<bvh_node,std::vector<std::shared_ptr<hittable>,std::allocator<std::shared_ptr<hittable>>>&,unsigned_long&,unsigned_long&,double&,double&>
              (&local_b8,(unsigned_long *)pvVar3,(unsigned_long *)&local_88,&local_c8,&local_f0);
    std::__shared_ptr<hittable,(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<hittable,(__gnu_cxx::_Lock_policy)2> *)this_00,
               (__shared_ptr<bvh_node,_(__gnu_cxx::_Lock_policy)2> *)&local_b8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &local_b8.
                super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>
                ._M_impl.super__Vector_impl_data._M_finish);
    dVar12 = local_f0;
    dVar13 = time1;
  }
  local_98 = 0.0;
  dStack_90 = 0.0;
  local_b8.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  dStack_a0 = 0.0;
  local_b8.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68 = 0.0;
  dStack_60 = 0.0;
  local_78 = 0.0;
  dStack_70 = 0.0;
  local_88 = 0.0;
  dStack_80 = 0.0;
  iVar5 = (*((__shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2> *)&p_Var11->_M_ptr)->_M_ptr->
            _vptr_hittable[1])(dVar12,dVar13);
  if ((char)iVar5 != '\0') {
    peVar2 = (this_00->super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    iVar5 = (*peVar2->_vptr_hittable[1])(local_f0,time1,peVar2,&local_88);
    if ((char)iVar5 != '\0') goto LAB_0010594a;
  }
  std::operator<<((ostream *)&std::cerr,"No bounding box in bvh_node constructor.\n");
LAB_0010594a:
  (this->box)._min.e[0] =
       (double)(~-(ulong)((double)local_b8.
                                  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start <= local_88) &
                (ulong)local_88 |
               (ulong)local_b8.
                      super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>
                      ._M_impl.super__Vector_impl_data._M_start &
               -(ulong)((double)local_b8.
                                super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>
                                ._M_impl.super__Vector_impl_data._M_start <= local_88));
  (this->box)._min.e[1] =
       (double)(~-(ulong)((double)local_b8.
                                  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish <= dStack_80) &
                (ulong)dStack_80 |
               (ulong)local_b8.
                      super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish &
               -(ulong)((double)local_b8.
                                super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish <= dStack_80));
  (this->box)._min.e[2] =
       (double)(~-(ulong)((double)local_b8.
                                  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage <= local_78) &
                (ulong)local_78 |
               (ulong)local_b8.
                      super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage &
               -(ulong)((double)local_b8.
                                super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage <= local_78));
  (this->box)._max.e[0] =
       (double)(~-(ulong)(dStack_70 <= dStack_a0) & (ulong)dStack_70 |
               (ulong)dStack_a0 & -(ulong)(dStack_70 <= dStack_a0));
  (this->box)._max.e[1] =
       (double)(~-(ulong)(local_68 <= local_98) & (ulong)local_68 |
               (ulong)local_98 & -(ulong)(local_68 <= local_98));
  (this->box)._max.e[2] =
       (double)(~-(ulong)(dStack_60 <= dStack_90) & (ulong)dStack_60 |
               (ulong)dStack_90 & -(ulong)(dStack_60 <= dStack_90));
  return;
}

Assistant:

bvh_node::bvh_node(
        std::vector<shared_ptr<hittable>>& objects,
        size_t start, size_t end, double time0, double time1
) {
    int axis = random_int(0,2);
    auto comparator = (axis == 0) ? box_x_compare
                    : (axis == 1) ? box_y_compare
                                  : box_z_compare;

    size_t object_span = end - start;

    if (object_span == 1) {
        left = right = objects[start];
    } else if (object_span == 2) {
        if (comparator(objects[start], objects[start+1])) {
            left = objects[start];
            right = objects[start+1];
        } else {
            left = objects[start+1];
            right = objects[start];
        }
    } else {
        std::sort(objects.begin() + start, objects.begin() + end, comparator);

        auto mid = start + object_span/2;
        left = make_shared<bvh_node>(objects, start, mid, time0, time1);
        right = make_shared<bvh_node>(objects, mid, end, time0, time1);
    }

    aabb box_left, box_right;

    if (  !left->bounding_box (time0, time1, box_left)
          || !right->bounding_box(time0, time1, box_right)
            )
        std::cerr << "No bounding box in bvh_node constructor.\n";

    box = surrounding_box(box_left, box_right);
}